

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

void __thiscall wallet::CWallet::ConnectScriptPubKeyManNotifiers(CWallet *this)

{
  undefined8 uVar1;
  _Base_ptr p_Var2;
  long in_FS_OFFSET;
  _Bind<void_(wallet::CWallet::*(wallet::CWallet_*,_std::_Placeholder<2>))(long)> local_e8;
  undefined1 local_d0 [24];
  weak_count local_b8;
  sockaddr local_b0;
  function1<void,_bool> local_98;
  undefined1 local_78 [24];
  _Rb_tree_node_base local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  GetActiveScriptPubKeyMans
            ((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
              *)(local_78 + 0x10),this);
  if (local_60._M_left != &local_60) {
    p_Var2 = local_60._M_left;
    do {
      uVar1 = *(undefined8 *)(p_Var2 + 1);
      boost::signals2::slot<void(bool),boost::function<void(bool)>>::
      slot<boost::signals2::signal<void(bool),boost::signals2::optional_last_value<void>,int,std::less<int>,boost::function<void(bool)>,boost::function<void(boost::signals2::connection_const&,bool)>,boost::signals2::mutex>>
                ((slot<void(bool),boost::function<void(bool)>> *)&local_b0,
                 &this->NotifyWatchonlyChanged);
      boost::signals2::
      signal<void_(bool),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(bool)>,_boost::function<void_(const_boost::signals2::connection_&,_bool)>,_boost::signals2::mutex>
      ::connect((signal<void_(bool),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(bool)>,_boost::function<void_(const_boost::signals2::connection_&,_bool)>,_boost::signals2::mutex>
                 *)local_78,(int)uVar1 + 0x10,&local_b0,0);
      boost::detail::weak_count::~weak_count((weak_count *)(local_78 + 8));
      boost::function1<void,_bool>::~function1(&local_98);
      std::
      vector<boost::variant<boost::weak_ptr<boost::signals2::detail::trackable_pointee>,_boost::weak_ptr<void>,_boost::signals2::detail::foreign_void_weak_ptr>,_std::allocator<boost::variant<boost::weak_ptr<boost::signals2::detail::trackable_pointee>,_boost::weak_ptr<void>,_boost::signals2::detail::foreign_void_weak_ptr>_>_>
      ::~vector((vector<boost::variant<boost::weak_ptr<boost::signals2::detail::trackable_pointee>,_boost::weak_ptr<void>,_boost::signals2::detail::foreign_void_weak_ptr>,_std::allocator<boost::variant<boost::weak_ptr<boost::signals2::detail::trackable_pointee>,_boost::weak_ptr<void>,_boost::signals2::detail::foreign_void_weak_ptr>_>_>
                 *)&local_b0);
      uVar1 = *(undefined8 *)(p_Var2 + 1);
      boost::signals2::slot<void(),boost::function<void()>>::
      slot<boost::signals2::signal<void(),boost::signals2::optional_last_value<void>,int,std::less<int>,boost::function<void()>,boost::function<void(boost::signals2::connection_const&)>,boost::signals2::mutex>>
                ((slot<void(),boost::function<void()>> *)&local_b0,
                 &this->NotifyCanGetAddressesChanged);
      boost::signals2::
      signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
      ::connect((signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
                 *)(local_d0 + 0x10),(int)uVar1 + 0x28,&local_b0,0);
      boost::detail::weak_count::~weak_count(&local_b8);
      boost::function0<void>::~function0((function0<void> *)&local_98);
      std::
      vector<boost::variant<boost::weak_ptr<boost::signals2::detail::trackable_pointee>,_boost::weak_ptr<void>,_boost::signals2::detail::foreign_void_weak_ptr>,_std::allocator<boost::variant<boost::weak_ptr<boost::signals2::detail::trackable_pointee>,_boost::weak_ptr<void>,_boost::signals2::detail::foreign_void_weak_ptr>_>_>
      ::~vector((vector<boost::variant<boost::weak_ptr<boost::signals2::detail::trackable_pointee>,_boost::weak_ptr<void>,_boost::signals2::detail::foreign_void_weak_ptr>,_std::allocator<boost::variant<boost::weak_ptr<boost::signals2::detail::trackable_pointee>,_boost::weak_ptr<void>,_boost::signals2::detail::foreign_void_weak_ptr>_>_>
                 *)&local_b0);
      uVar1 = *(undefined8 *)(p_Var2 + 1);
      local_e8._M_f = (offset_in_CWallet_to_subr)MaybeUpdateBirthTime;
      local_e8._8_8_ = 0;
      local_e8._M_bound_args.super__Tuple_impl<0UL,_wallet::CWallet_*,_std::_Placeholder<2>_>.
      super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_wallet::CWallet_*,_std::_Placeholder<2>_>)
           (_Tuple_impl<0UL,_wallet::CWallet_*,_std::_Placeholder<2>_>)this;
      boost::signals2::
      slot<void(wallet::ScriptPubKeyMan_const*,long),boost::function<void(wallet::ScriptPubKeyMan_const*,long)>>
      ::slot<std::_Bind<void(wallet::CWallet::*(wallet::CWallet*,std::_Placeholder<2>))(long)>>
                ((slot<void(wallet::ScriptPubKeyMan_const*,long),boost::function<void(wallet::ScriptPubKeyMan_const*,long)>>
                  *)&local_b0,&local_e8);
      boost::signals2::
      signal<void_(const_wallet::ScriptPubKeyMan_*,_long),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_wallet::ScriptPubKeyMan_*,_long)>,_boost::function<void_(const_boost::signals2::connection_&,_const_wallet::ScriptPubKeyMan_*,_long)>,_boost::signals2::mutex>
      ::connect((signal<void_(const_wallet::ScriptPubKeyMan_*,_long),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_wallet::ScriptPubKeyMan_*,_long)>,_boost::function<void_(const_boost::signals2::connection_&,_const_wallet::ScriptPubKeyMan_*,_long)>,_boost::signals2::mutex>
                 *)local_d0,(int)uVar1 + 0x40,&local_b0,0);
      boost::detail::weak_count::~weak_count((weak_count *)(local_d0 + 8));
      boost::function2<void,_const_wallet::ScriptPubKeyMan_*,_long>::~function2
                ((function2<void,_const_wallet::ScriptPubKeyMan_*,_long> *)&local_98);
      std::
      vector<boost::variant<boost::weak_ptr<boost::signals2::detail::trackable_pointee>,_boost::weak_ptr<void>,_boost::signals2::detail::foreign_void_weak_ptr>,_std::allocator<boost::variant<boost::weak_ptr<boost::signals2::detail::trackable_pointee>,_boost::weak_ptr<void>,_boost::signals2::detail::foreign_void_weak_ptr>_>_>
      ::~vector((vector<boost::variant<boost::weak_ptr<boost::signals2::detail::trackable_pointee>,_boost::weak_ptr<void>,_boost::signals2::detail::foreign_void_weak_ptr>,_std::allocator<boost::variant<boost::weak_ptr<boost::signals2::detail::trackable_pointee>,_boost::weak_ptr<void>,_boost::signals2::detail::foreign_void_weak_ptr>_>_>
                 *)&local_b0);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2);
    } while (p_Var2 != &local_60);
  }
  std::
  _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  ::~_Rb_tree((_Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
               *)(local_78 + 0x10));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::ConnectScriptPubKeyManNotifiers()
{
    for (const auto& spk_man : GetActiveScriptPubKeyMans()) {
        spk_man->NotifyWatchonlyChanged.connect(NotifyWatchonlyChanged);
        spk_man->NotifyCanGetAddressesChanged.connect(NotifyCanGetAddressesChanged);
        spk_man->NotifyFirstKeyTimeChanged.connect(std::bind(&CWallet::MaybeUpdateBirthTime, this, std::placeholders::_2));
    }
}